

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void nite::graphicsInit(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  GLenum GVar6;
  char *pcVar7;
  Indexer *this;
  longlong lVar8;
  uint uVar9;
  EVP_PKEY_CTX *ctx;
  string *psVar10;
  int i;
  ulong uVar11;
  long lVar12;
  undefined1 local_120 [4];
  int local_11c;
  SDL_DisplayMode DM;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c8;
  Uint32 local_c4;
  Node node;
  Node local_a0;
  allocator local_92;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string err;
  
  updateDelta();
  printInit();
  psVar10 = (string *)0xf231;
  iVar2 = SDL_Init();
  if (iVar2 < 0) {
    pcVar7 = (char *)SDL_GetError();
    std::__cxx11::string::string
              ((string *)local_70,pcVar7,(allocator *)(err.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err.field_2 + 8),"fatal error: SDL was unable to start: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    print((string *)((long)&err.field_2 + 8));
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    gameExit();
    psVar10 = (string *)local_70;
    std::__cxx11::string::~string(psVar10);
  }
  AsyncTask::init((EVP_PKEY_CTX *)psVar10);
  socketInit();
  FileTransfer::init((EVP_PKEY_CTX *)psVar10);
  inderxerInit();
  this = getIndexer();
  std::__cxx11::string::string
            ((string *)local_70,"./data/map/",(allocator *)(err.field_2._M_local_buf + 8));
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string
            ((string *)local_70,"./data/tileset/",(allocator *)(err.field_2._M_local_buf + 8));
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string
            ((string *)local_70,"./data/texture/tileset/",
             (allocator *)(err.field_2._M_local_buf + 8));
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string
            ((string *)local_70,"./data/texture/overworld/",
             (allocator *)(err.field_2._M_local_buf + 8));
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string
            ((string *)local_70,"./data/texture/weaps/",(allocator *)(err.field_2._M_local_buf + 8))
  ;
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string
            ((string *)local_70,"./data/texture/ammo/",(allocator *)(err.field_2._M_local_buf + 8));
  Indexer::indexDir(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  signal(2,ctrlC);
  SDL_GetCurrentDisplayMode(0,local_120);
  print("reading data/config.json file");
  Jzon::Parser::Parser((Parser *)local_70);
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"data/config.json",(allocator *)&local_90);
  Jzon::Parser::parseFile((Parser *)&stack0xffffffffffffff40,(string *)local_70);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8),"width",&local_92);
  Jzon::Node::get((Node *)&DM.driverdata,(string *)&stack0xffffffffffffff40);
  iVar2 = Jzon::Node::toInt((Node *)&DM.driverdata,0x500);
  std::__cxx11::string::string((string *)&local_90,"height",&local_91);
  Jzon::Node::get(&local_a0,(string *)&stack0xffffffffffffff40);
  iVar3 = Jzon::Node::toInt(&local_a0,0x2d0);
  Vec2::Vec2((Vec2 *)&local_e8,(float)iVar2,(float)iVar3);
  ::size = (Vec2)local_e8._M_dataplus._M_p;
  Jzon::Node::~Node(&local_a0);
  std::__cxx11::string::~string((string *)&local_90);
  Jzon::Node::~Node((Node *)&DM.driverdata);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"bpp",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  bitsPerPixel = Jzon::Node::toInt((Node *)&local_90,0x20);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"autoresolution",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  autoResolution = Jzon::Node::toBool((Node *)&local_90,false);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"fullscreen",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  enableFullscreen = Jzon::Node::toBool((Node *)&local_90,false);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"vsync",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  enableVSync = Jzon::Node::toBool((Node *)&local_90,true);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"borderless",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  enableBorderless = Jzon::Node::toBool((Node *)&local_90,false);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"resizeable",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  enableResizable = Jzon::Node::toBool((Node *)&local_90,false);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(err.field_2._M_local_buf + 8),"targetexcess",(allocator *)&local_e8);
  Jzon::Node::get((Node *)&local_90,(string *)&stack0xffffffffffffff40);
  local_c4 = DM.format;
  local_c8 = local_11c;
  targetExcess = Jzon::Node::toFloat((Node *)&local_90,1.0);
  Jzon::Node::~Node((Node *)&local_90);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  Jzon::Node::~Node((Node *)&stack0xffffffffffffff40);
  Jzon::Parser::~Parser((Parser *)local_70);
  lVar12 = 0x20;
  uVar11 = 0;
  do {
    if ((ulong)((long)parameters_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)parameters_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
      uVar4 = (uint)enableFullscreen;
      uVar9 = (uint)enableBorderless;
      uVar5 = (uint)enableResizable;
      if (autoResolution != false) {
        Vec2::set(&::size,(float)local_c8,(float)(int)local_c4);
      }
      SDL_GL_SetAttribute(0xd,1);
      SDL_GL_SetAttribute(0xe,0x10);
      glEnable(0x809d);
      Window = (SDL_Window *)
               SDL_CreateWindow("R E D   B I A S",0x2fff0000,0x2fff0000,(int)::size.x,(int)::size.y,
                                uVar5 * 0x20 + (uVar9 << 4 | uVar4) + 2);
      if (Window == (SDL_Window *)0x0) {
        Vec2::str_abi_cxx11_((string *)&stack0xffffffffffffff40,&::size);
        std::operator+(&local_90,"failed to create window | size ",
                       (string *)&stack0xffffffffffffff40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err.field_2 + 8),&local_90,": ");
        pcVar7 = (char *)SDL_GetError();
        std::__cxx11::string::string((string *)&local_e8,pcVar7,(allocator *)&DM.driverdata);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&err.field_2 + 8),&local_e8);
        print((string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_90);
        psVar10 = (string *)&stack0xffffffffffffff40;
        std::__cxx11::string::~string(psVar10);
        exit((int)psVar10);
      }
      Context = (SDL_GLContext)SDL_GL_CreateContext(Window);
      SDL_GL_MakeCurrent(Window,Context);
      GVar6 = glewInit();
      if (GVar6 != 0) {
        iVar2 = 0x23d6f8;
        print("GLEW failed to initialize.");
        exit(iVar2);
      }
      graphicsInitd = 1;
      running = 1;
      glClearColor(0,0,0,0x3f800000);
      glClear(0x4000);
      glDisable(0xb71);
      glEnable(0xde1);
      glEnable(0xbe2);
      glBlendFunc(0x302,0x303);
      glViewport(0,0,(int)::size.x,(int)::size.y);
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0,(double)::size.x,(double)::size.y,0,0x3ff0000000000000,0xbff0000000000000);
      glMatrixMode(0x1700);
      glLoadIdentity();
      glTexParameteri(0xde1,0x2801,0x2601);
      ctx = (EVP_PKEY_CTX *)0x2800;
      glTexParameteri(0xde1,0x2800,0x2601);
      SDL_GL_SetSwapInterval(enableVSync);
      SDL_GL_SetSwapInterval(enableVSync);
      for (lVar12 = 0; lVar12 != 0x3c0; lVar12 = lVar12 + 0x50) {
        RenderTarget::init((RenderTarget *)
                           ((long)&targets[0].objects.
                                   super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar12),ctx);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "nite engine | OS ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     niteCurrentPlatform_abi_cxx11_);
      print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      Vec2::str_abi_cxx11_(&local_e8,&::size);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff40,"graphics init ",&local_e8);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff40," (");
      if (enableFullscreen == true) {
        std::__cxx11::string::string((string *)&DM.driverdata,"fullscreen",(allocator *)&local_a0);
      }
      else {
        std::__cxx11::string::string((string *)&DM.driverdata,"windowed",(allocator *)&local_a0);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err.field_2 + 8),&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DM.driverdata);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err.field_2 + 8),")");
      print((string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&DM.driverdata);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::__cxx11::string::~string((string *)&local_e8);
      return;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&parameters_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                            lVar12),"-wd");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&parameters_abi_cxx11_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar12),"--windowed"), bVar1)) {
LAB_0018b54c:
      enableFullscreen = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&parameters_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p
                              + lVar12),"-ars");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&parameters_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-1].
                                             _M_dataplus._M_p + lVar12),"--auto-resolution"), bVar1)
         ) {
        autoResolution = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&parameters_abi_cxx11_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar12),"-fs");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               _M_dataplus._M_p + lVar12),"--fullscreen"), bVar1))
        goto LAB_0018b54c;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&parameters_abi_cxx11_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar12),"-rs");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               _M_dataplus._M_p + lVar12),"--resizeable"), bVar1)) {
          enableResizable = true;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&parameters_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-1].
                                             _M_dataplus._M_p + lVar12),"-bdl");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&parameters_abi_cxx11_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                                 _M_dataplus._M_p + lVar12),"--borderless"), bVar1))
          {
            enableBorderless = true;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               _M_dataplus._M_p + lVar12),"-w");
            if (((bVar1) ||
                (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&parameters_abi_cxx11_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),"--width"), bVar1)) &&
               (uVar11 < ((long)parameters_abi_cxx11_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)parameters_abi_cxx11_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              lVar8 = toInt((string *)
                            ((long)&((parameters_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar12));
              ::size.x = (float)lVar8;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&parameters_abi_cxx11_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                                 _M_dataplus._M_p + lVar12),"-h");
              if (((bVar1) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&parameters_abi_cxx11_.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),"--height"), bVar1)) &&
                 (uVar11 < ((long)parameters_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)parameters_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                lVar8 = toInt((string *)
                              ((long)&((parameters_abi_cxx11_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar12));
                ::size.y = (float)lVar8;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&parameters_abi_cxx11_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),"-vsync");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&parameters_abi_cxx11_.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),
                                            "--vertical-synchronization"), bVar1)) {
                  enableVSync = true;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&parameters_abi_cxx11_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),"-nvsync");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&parameters_abi_cxx11_.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + lVar12),
                                              "--no-vertical-synchronization"), bVar1)) {
                    enableVSync = false;
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar11 = uVar11 + 1;
    lVar12 = lVar12 + 0x20;
  } while( true );
}

Assistant:

void nite::graphicsInit(){
	nite::updateDelta();
	nite::printInit();
	if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
		String err = SDL_GetError();
		nite::print("fatal error: SDL was unable to start: "+err);
		 gameExit();
	}
	nite::AsyncTask::init();
	nite::socketInit();
	nite::FileTransfer::init();
	nite::inderxerInit();
    auto indexer = nite::getIndexer();
    indexer->indexDir("./data/map/");
    indexer->indexDir("./data/tileset/");
    indexer->indexDir("./data/texture/tileset/");
	indexer->indexDir("./data/texture/overworld/");
	indexer->indexDir("./data/texture/weaps/");
	indexer->indexDir("./data/texture/ammo/");
	signal(SIGINT, ctrlC);

	int Flags = SDL_WINDOW_OPENGL;

	SDL_DisplayMode DM;
	SDL_GetCurrentDisplayMode(0, &DM);
	auto displayWidth = DM.w;
	auto displayHeight = DM.h;

	readConfigFile();

	for(int i = 0; i < parameters.size(); ++i){
		if(parameters[i] == "-wd" || parameters[i] == "--windowed"){
			enableFullscreen = true;
		}else		
		if(parameters[i] == "-ars" || parameters[i] == "--auto-resolution"){
			autoResolution = true;
		}else
		if(parameters[i] == "-fs" || parameters[i] == "--fullscreen"){
			enableFullscreen = true;
		}else
		if(parameters[i] == "-rs" || parameters[i] == "--resizeable"){
			enableResizable = true;
		}else
		if(parameters[i] == "-bdl" || parameters[i] == "--borderless"){
			enableBorderless = true;
		}else
		if((parameters[i] == "-w" || parameters[i] == "--width") && i < parameters.size()-1){
			size.x = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-h" || parameters[i] == "--height") && i < parameters.size()-1){
			size.y = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-vsync" || parameters[i] == "--vertical-synchronization")){
			enableVSync = true;
		}else
		if((parameters[i] == "-nvsync" || parameters[i] == "--no-vertical-synchronization")){
			enableVSync = false;
		}											
	}

	if(enableFullscreen){
		Flags |= SDL_WINDOW_FULLSCREEN;
	}
	if(enableBorderless){
		Flags |= SDL_WINDOW_BORDERLESS;
	}
	if(enableResizable){
		Flags |= SDL_WINDOW_RESIZABLE;
	}
	if(autoResolution){
		size.set(displayWidth, displayHeight);
	}

	const char *n = "R E D   B I A S";

   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 16);
   glEnable(GL_MULTISAMPLE);

	Window = SDL_CreateWindow(n, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.x, size.y, Flags);
	
	if(Window == NULL){
		nite::print("failed to create window | size "+size.str()+": "+String(SDL_GetError()));
		nite::exit();
	}
	
	Context = SDL_GL_CreateContext(Window);
	SDL_GL_MakeCurrent(Window, Context);

	if (glewInit() != GLEW_OK){
		nite::print("GLEW failed to initialize.");
		nite::exit();
	}

	graphicsInitd = true;
	running = true;

	setupOpenGL();
	SDL_GL_SetSwapInterval(enableVSync ? 1 : 0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		targets[c].init();
	}

	nite::print("nite engine | OS "+niteCurrentPlatform);
	nite::print("graphics init "+size.str()+" ("+(enableFullscreen ? String("fullscreen") : String("windowed"))+")");
	// debugFont.load("data/font/VeraMono.ttf", 18 * nite::getGeneralScale());
}